

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpsClient.cpp
# Opt level: O2

void __thiscall xmrig::HttpsClient::handshake(HttpsClient *this)

{
  SSL *pSVar1;
  String *pSVar2;
  
  pSVar1 = SSL_new((SSL_CTX *)this->m_ctx);
  this->m_ssl = (SSL *)pSVar1;
  if (pSVar1 != (SSL *)0x0) {
    SSL_set_connect_state(pSVar1);
    SSL_set_bio((SSL *)this->m_ssl,(BIO *)this->m_readBio,(BIO *)this->m_writeBio);
    pSVar1 = (SSL *)this->m_ssl;
    pSVar2 = HttpClient::host(&this->super_HttpClient);
    SSL_ctrl(pSVar1,0x37,0,pSVar2->m_data);
    SSL_do_handshake((SSL *)this->m_ssl);
    flush(this);
    return;
  }
  return;
}

Assistant:

void xmrig::HttpsClient::handshake()
{
    m_ssl = SSL_new(m_ctx);
    assert(m_ssl != nullptr);

    if (!m_ssl) {
        return;
    }

    SSL_set_connect_state(m_ssl);
    SSL_set_bio(m_ssl, m_readBio, m_writeBio);
    SSL_set_tlsext_host_name(m_ssl, host().data());

    SSL_do_handshake(m_ssl);

    flush();
}